

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

char * xe::getTestCaseTypeName(TestCaseType caseType)

{
  if (caseType < TESTCASETYPE_LAST) {
    return &DAT_0011f4f4 + *(int *)(&DAT_0011f4f4 + (ulong)caseType * 4);
  }
  return (char *)0x0;
}

Assistant:

const char* getTestCaseTypeName (TestCaseType caseType)
{
	switch (caseType)
	{
		case TESTCASETYPE_SELF_VALIDATE:	return "SelfValidate";
		case TESTCASETYPE_CAPABILITY:		return "Capability";
		case TESTCASETYPE_ACCURACY:			return "Accuracy";
		case TESTCASETYPE_PERFORMANCE:		return "Performance";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}